

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O2

bool __thiscall QHttpNetworkConnectionChannel::resetUploadData(QHttpNetworkConnectionChannel *this)

{
  char cVar1;
  ConnectionType CVar2;
  QNonContiguousByteDevice *pQVar3;
  
  if (*(long *)(this + 0x38) != 0) {
    CVar2 = QHttpNetworkConnection::connectionType(*(QHttpNetworkConnection **)(this + 0xf8));
    if (CVar2 == ConnectionTypeHTTP2Direct) {
      return true;
    }
    if (this[0x88] != (QHttpNetworkConnectionChannel)0x0) {
      return true;
    }
    pQVar3 = QHttpNetworkRequest::uploadByteDevice((QHttpNetworkRequest *)(this + 0x28));
    if (pQVar3 == (QNonContiguousByteDevice *)0x0) {
      return true;
    }
    cVar1 = (**(code **)(*(long *)pQVar3 + 0x80))(pQVar3);
    if (cVar1 != '\0') {
      *(undefined8 *)(this + 0x40) = 0;
      return true;
    }
    QHttpNetworkConnectionPrivate::emitReplyError
              (*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8),
               *(QIODevice **)(this + 0x10),*(QHttpNetworkReply **)(this + 0x38),ContentReSendError)
    ;
  }
  return false;
}

Assistant:

bool QHttpNetworkConnectionChannel::resetUploadData()
{
    if (!reply) {
        //this happens if server closes connection while QHttpNetworkConnectionPrivate::_q_startNextRequest is pending
        return false;
    }
    if (connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2Direct
        || switchedToHttp2) {
        // The else branch doesn't make any sense for HTTP/2, since 1 channel is multiplexed into
        // many streams. And having one stream fail to reset upload data should not completely close
        // the channel. Handled in the http2 protocol handler.
    } else if (QNonContiguousByteDevice *uploadByteDevice = request.uploadByteDevice()) {
        if (!uploadByteDevice->reset()) {
            connection->d_func()->emitReplyError(socket, reply, QNetworkReply::ContentReSendError);
            return false;
        }
        written = 0;
    }
    return true;
}